

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int TestRegNumEncoding(CodeGenGenericContext *ctx,uchar *stream,x86Command op,
                      _func_int_uchar_ptr_x86Reg_int *fun,bool onlySmall)

{
  int iVar1;
  uint local_3c;
  uint reg;
  uchar *start;
  bool onlySmall_local;
  _func_int_uchar_ptr_x86Reg_int *fun_local;
  uchar *puStack_18;
  x86Command op_local;
  uchar *stream_local;
  CodeGenGenericContext *ctx_local;
  
  puStack_18 = stream;
  for (local_3c = 0; local_3c < 9; local_3c = local_3c + 1) {
    EMIT_OP_REG_NUM(ctx,op,testRegs[local_3c],4);
    iVar1 = (*fun)(puStack_18,testRegs[local_3c],4);
    puStack_18 = puStack_18 + iVar1;
    if (!onlySmall) {
      EMIT_OP_REG_NUM(ctx,op,testRegs[local_3c],0x400);
      iVar1 = (*fun)(puStack_18,testRegs[local_3c],0x400);
      puStack_18 = puStack_18 + iVar1;
    }
  }
  return (int)puStack_18 - (int)stream;
}

Assistant:

int TestRegNumEncoding(CodeGenGenericContext &ctx, unsigned char *stream, x86Command op, int (*fun)(unsigned char *stream, x86Reg dst, int num), bool onlySmall = false)
{
	unsigned char *start = stream;

	for(unsigned reg = 0; reg < sizeof(testRegs) / sizeof(testRegs[0]); reg++)
	{
		EMIT_OP_REG_NUM(ctx, op, testRegs[reg], 4);
		stream += fun(stream, testRegs[reg], 4);

		if(!onlySmall)
		{
			EMIT_OP_REG_NUM(ctx, op, testRegs[reg], 1024);
			stream += fun(stream, testRegs[reg], 1024);
		}
	}

	return int(stream - start);
}